

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O1

string * __thiscall
libcellml::GeneratorProfile::implementationVariableInfoString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this)

{
  GeneratorProfileImpl *pGVar1;
  pointer pcVar2;
  
  pGVar1 = this->mPimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pGVar1->mImplementationVariableInfoString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pGVar1->mImplementationVariableInfoString)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::implementationVariableInfoString() const
{
    return mPimpl->mImplementationVariableInfoString;
}